

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

void convert_expr_top(iasctx *ctx,easm_expr *expr)

{
  easm_expr_type eVar1;
  litem *plVar2;
  litem *plVar3;
  litem **pplVar4;
  int iVar5;
  int iVar6;
  
  eVar1 = expr->type;
  plVar2 = (litem *)calloc(0x20,1);
  if (eVar1 == EASM_EXPR_SINSN) {
    plVar3 = (litem *)calloc(0x20,1);
    plVar2->type = LITEM_SESTART;
    plVar3->type = LITEM_SEEND;
    iVar5 = ctx->atomsnum;
    iVar6 = ctx->atomsmax;
    if (iVar5 < iVar6) {
      pplVar4 = ctx->atoms;
    }
    else {
      iVar5 = 0x10;
      if (iVar6 != 0) {
        iVar5 = iVar6 * 2;
      }
      ctx->atomsmax = iVar5;
      pplVar4 = (litem **)realloc(ctx->atoms,(long)iVar5 << 3);
      ctx->atoms = pplVar4;
      iVar5 = ctx->atomsnum;
    }
    ctx->atomsnum = iVar5 + 1;
    pplVar4[iVar5] = plVar2;
    convert_sinsn(ctx,expr->sinsn);
    iVar6 = ctx->atomsnum;
    iVar5 = ctx->atomsmax;
    pplVar4 = ctx->atoms;
    plVar2 = plVar3;
    if (iVar5 <= iVar6) {
      iVar6 = 0x10;
      if (iVar5 != 0) {
        iVar6 = iVar5 * 2;
      }
      ctx->atomsmax = iVar6;
      pplVar4 = (litem **)realloc(pplVar4,(long)iVar6 << 3);
      ctx->atoms = pplVar4;
      iVar6 = ctx->atomsnum;
    }
  }
  else {
    plVar2->type = LITEM_EXPR;
    plVar2->expr = expr;
    iVar6 = ctx->atomsnum;
    iVar5 = ctx->atomsmax;
    if (iVar6 < iVar5) {
      pplVar4 = ctx->atoms;
    }
    else {
      iVar6 = 0x10;
      if (iVar5 != 0) {
        iVar6 = iVar5 * 2;
      }
      ctx->atomsmax = iVar6;
      pplVar4 = (litem **)realloc(ctx->atoms,(long)iVar6 << 3);
      ctx->atoms = pplVar4;
      iVar6 = ctx->atomsnum;
    }
  }
  ctx->atomsnum = iVar6 + 1;
  pplVar4[iVar6] = plVar2;
  return;
}

Assistant:

void convert_expr_top(struct iasctx *ctx, struct easm_expr *expr) {
	if (expr->type == EASM_EXPR_SINSN) {
		struct litem *ses = calloc(sizeof *ses, 1);
		struct litem *see = calloc(sizeof *see, 1);
		ses->type = LITEM_SESTART;
		see->type = LITEM_SEEND;
		ADDARRAY(ctx->atoms, ses);
		convert_sinsn(ctx, expr->sinsn);
		ADDARRAY(ctx->atoms, see);
	} else {
		struct litem *li = calloc(sizeof *li, 1);
		li->type = LITEM_EXPR;
		li->expr = expr;
		ADDARRAY(ctx->atoms, li);
	}
}